

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

int __thiscall glslang::TScanContext::secondGenerationImage(TScanContext *this)

{
  bool bVar1;
  uint uVar2;
  TScanContext *this_local;
  
  bVar1 = TParseVersions::isEsProfile(&this->parseContext->super_TParseVersions);
  if ((bVar1) && (0x135 < (this->parseContext->super_TParseVersions).version)) {
    reservedWord(this);
    this_local._4_4_ = this->keyword;
  }
  else {
    bVar1 = TSymbolTable::atBuiltInLevel(this->parseContext->symbolTable);
    if ((bVar1) ||
       ((bVar1 = TParseVersions::isEsProfile(&this->parseContext->super_TParseVersions), !bVar1 &&
        ((0x1a3 < (this->parseContext->super_TParseVersions).version ||
         (uVar2 = (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[8])
                            (this->parseContext,"GL_ARB_shader_image_load_store"), (uVar2 & 1) != 0)
         ))))) {
      this_local._4_4_ = this->keyword;
    }
    else {
      bVar1 = TParseVersions::isForwardCompatible(&this->parseContext->super_TParseVersions);
      if (bVar1) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2e])
                  (this->parseContext,&this->loc,"using future type keyword",this->tokenText,"");
      }
      this_local._4_4_ = identifierOrType(this);
    }
  }
  return this_local._4_4_;
}

Assistant:

int TScanContext::secondGenerationImage()
{
    if (parseContext.isEsProfile() && parseContext.version >= 310) {
        reservedWord();
        return keyword;
    }

    if (parseContext.symbolTable.atBuiltInLevel() ||
        (!parseContext.isEsProfile() &&
         (parseContext.version >= 420 || parseContext.extensionTurnedOn(E_GL_ARB_shader_image_load_store))))
        return keyword;

    if (parseContext.isForwardCompatible())
        parseContext.warn(loc, "using future type keyword", tokenText, "");

    return identifierOrType();
}